

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O1

bool __thiscall
Js::BufferWriter::WriteArray<Js::FldInfo>(BufferWriter *this,FldInfo *data,size_t len)

{
  ulong uVar1;
  ulong sizeInBytes;
  
  sizeInBytes = len * 4;
  uVar1 = this->lengthLeft;
  if (sizeInBytes <= uVar1) {
    memcpy_s(this->current,sizeInBytes,data,sizeInBytes);
    this->current = this->current + sizeInBytes;
    this->lengthLeft = this->lengthLeft + len * -4;
  }
  return sizeInBytes <= uVar1;
}

Assistant:

bool WriteArray(__in_ecount(len) T * data, size_t len)
        {
            size_t size = sizeof(T) * len;
            if (lengthLeft < size)
            {
                return false;
            }
            memcpy_s(current, size, data, size);
            current += size;
            lengthLeft -= size;
            return true;
        }